

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzio.c
# Opt level: O0

int cm_zlib_gzclose(gzFile file)

{
  int iVar1;
  gz_stream *s;
  gzFile file_local;
  
  if (file == (gzFile)0x0) {
    file_local._4_4_ = -2;
  }
  else {
    if (*(char *)((long)file + 0xac) == 'w') {
      iVar1 = do_flush(file,4);
      if (iVar1 != 0) {
        iVar1 = destroy((gz_stream *)file);
        return iVar1;
      }
      putLong(*(FILE **)((long)file + 0x78),*(uLong *)((long)file + 0x90));
      putLong(*(FILE **)((long)file + 0x78),*(ulong *)((long)file + 0xb8) & 0xffffffff);
    }
    file_local._4_4_ = destroy((gz_stream *)file);
  }
  return file_local._4_4_;
}

Assistant:

int ZEXPORT gzclose (file)
    gzFile file;
{
    gz_stream *s = (gz_stream*)file;

    if (s == NULL) return Z_STREAM_ERROR;

    if (s->mode == 'w') {
#ifdef NO_GZCOMPRESS
        return Z_STREAM_ERROR;
#else
        if (do_flush (file, Z_FINISH) != Z_OK)
            return destroy((gz_stream*)file);

        putLong (s->file, s->crc);
        putLong (s->file, (uLong)(s->in & 0xffffffff));
#endif
    }
    return destroy((gz_stream*)file);
}